

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utColladaExportLight.cpp
# Opt level: O0

void __thiscall
ColladaExportLight_testExportLight_Test::TestBody(ColladaExportLight_testExportLight_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  aiLight *paVar6;
  type paVar7;
  char *pcVar8;
  size_t __n;
  char *in_R9;
  aiLight *local_460;
  AssertHelper local_420;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_17;
  Message local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_16;
  Message local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_15;
  Message local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_14;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_13;
  Message local_378;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_12;
  Message local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_11;
  Message local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_10;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_9;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_8;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_7;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_6;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_5;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  int local_230 [2];
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  aiLight *read;
  aiLight *orig;
  size_t i_1;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1c0;
  Message local_1b8;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__2;
  aiScene *imported;
  Message local_140;
  aiReturn local_138 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  value_type local_118;
  ulong local_f8;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  origNames;
  unique_ptr<aiLight[],_std::default_delete<aiLight[]>_> origLights;
  undefined1 local_c8 [4];
  uint origNumLights;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  string local_78;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  aiScene *pTest;
  char *file;
  ColladaExportLight_testExportLight_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Assimp::Importer::ReadFile
                 ((this->super_ColladaExportLight).im,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/Collada/lights.dae"
                  ,0x400);
  local_31 = (aiScene *)gtest_ar_.message_.ptr_ != (aiScene *)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_30,(AssertionResult *)"pTest!=NULL","false","true",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(local_50);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    local_91 = aiScene::HasLights((aiScene *)gtest_ar_.message_.ptr_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_90,&local_91,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar2) {
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)local_90,(AssertionResult *)"pTest->HasLights()",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                 ,0x4f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)local_c8);
      testing::Message::~Message(&local_a0);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      origLights._M_t.super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>._M_t.
      super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
      super__Head_base<0UL,_aiLight_*,_false>._M_head_impl._4_4_ =
           *(uint *)&gtest_ar_.message_.ptr_[2].field_2;
      uVar4 = CONCAT44(0,origLights._M_t.
                         super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>._M_t.
                         super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
                         super__Head_base<0UL,_aiLight_*,_false>._M_head_impl._4_4_);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      uVar5 = SUB168(auVar1 * ZEXT816(0x46c),0);
      if (SUB168(auVar1 * ZEXT816(0x46c),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      paVar6 = (aiLight *)operator_new__(uVar5);
      if (uVar4 != 0) {
        local_460 = paVar6;
        do {
          aiLight::aiLight(local_460);
          local_460 = local_460 + 1;
        } while (local_460 != paVar6 + uVar4);
      }
      std::unique_ptr<aiLight[],std::default_delete<aiLight[]>>::
      unique_ptr<aiLight*,std::default_delete<aiLight[]>,void,bool>
                ((unique_ptr<aiLight[],std::default_delete<aiLight[]>> *)
                 &origNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,paVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
      for (local_f8 = 0;
          local_f8 <
          origLights._M_t.super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>._M_t.
          super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
          super__Head_base<0UL,_aiLight_*,_false>._M_head_impl._4_4_; local_f8 = local_f8 + 1) {
        pcVar3 = aiString::C_Str(*(aiString **)
                                  (*(long *)((long)&gtest_ar_.message_.ptr_[2].field_2 + 8) +
                                  local_f8 * 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_118,pcVar3,(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&i,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
        paVar6 = *(aiLight **)
                  (*(long *)((long)&gtest_ar_.message_.ptr_[2].field_2 + 8) + local_f8 * 8);
        paVar7 = std::unique_ptr<aiLight[],_std::default_delete<aiLight[]>_>::operator[]
                           ((unique_ptr<aiLight[],_std::default_delete<aiLight[]>_> *)
                            &origNames.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_f8);
        aiLight::operator=(paVar7,paVar6);
      }
      local_138[1] = 0;
      pcVar3 = (char *)0x0;
      local_138[0] = Assimp::Exporter::Export
                               ((this->super_ColladaExportLight).ex,
                                (aiScene *)gtest_ar_.message_.ptr_,"collada","lightsExp.dae",0,
                                (ExportProperties *)0x0);
      testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
                ((EqHelper<false> *)local_130,"aiReturn_SUCCESS",
                 "ex->Export(pTest,\"collada\",file)",local_138 + 1,local_138);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
      if (!bVar2) {
        testing::Message::Message(&local_140);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&imported,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                   ,0x59,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&imported,&local_140);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&imported);
        testing::Message::~Message(&local_140);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
      gtest_ar__2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Assimp::Importer::ReadFile((this->super_ColladaExportLight).im,"lightsExp.dae",0x400);
      local_161 = (aiScene *)gtest_ar__2.message_.ptr_ != (aiScene *)0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_160,&local_161,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
      if (!bVar2) {
        testing::Message::Message(&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_160,
                   (AssertionResult *)"imported!=NULL","false","true",pcVar3);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                   ,0x5d,pcVar8);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_170);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        local_1a9 = aiScene::HasLights((aiScene *)gtest_ar__2.message_.ptr_);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
        if (!bVar2) {
          testing::Message::Message(&local_1b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1.message_,(internal *)local_1a8,
                     (AssertionResult *)"imported->HasLights()","false","true",pcVar3);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                     ,0x5f,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
          testing::internal::AssertHelper::~AssertHelper(&local_1c0);
          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_1b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
        testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                  ((EqHelper<false> *)local_1f0,"origNumLights","imported->mNumLights",
                   (uint *)((long)&origLights._M_t.
                                   super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>
                                   .super__Head_base<0UL,_aiLight_*,_false>._M_head_impl + 4),
                   (uint *)&gtest_ar__2.message_.ptr_[2].field_2._M_allocated_capacity);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
        if (!bVar2) {
          testing::Message::Message(&local_1f8);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i_1,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                     ,0x60,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_1f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
          testing::Message::~Message(&local_1f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
        for (orig = (aiLight *)0x0;
            orig < (aiLight *)
                   (ulong)origLights._M_t.
                          super___uniq_ptr_impl<aiLight,_std::default_delete<aiLight[]>_>._M_t.
                          super__Tuple_impl<0UL,_aiLight_*,_std::default_delete<aiLight[]>_>.
                          super__Head_base<0UL,_aiLight_*,_false>._M_head_impl._4_4_;
            orig = (aiLight *)((long)&(orig->mName).length + 1)) {
          paVar7 = std::unique_ptr<aiLight[],_std::default_delete<aiLight[]>_>::operator[]
                             ((unique_ptr<aiLight[],_std::default_delete<aiLight[]>_> *)
                              &origNames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_t)orig);
          gtest_ar_2.message_.ptr_ =
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (*(long *)((long)&gtest_ar__2.message_.ptr_[2].field_2 + 8) + (long)orig * 8);
          local_230[1] = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i,(size_type)orig);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          pcVar8 = aiString::C_Str((aiString *)gtest_ar_2.message_.ptr_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&i,(size_type)orig);
          __n = std::__cxx11::string::size();
          local_230[0] = strncmp(pcVar3,pcVar8,__n);
          testing::internal::EqHelper<true>::Compare<int,int>
                    (local_228,"0",
                     (int *)
                     "strncmp(origNames[ i ].c_str(),read->mName.C_Str(), origNames[ i ].size() )",
                     local_230 + 1,local_230);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
          if (!bVar2) {
            testing::Message::Message(&local_238);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,100,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_238);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_238);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
          testing::internal::EqHelper<false>::Compare<aiLightSourceType,aiLightSourceType>
                    ((EqHelper<false> *)local_250,"orig->mType","read->mType",&paVar7->mType,
                     (aiLightSourceType *)&gtest_ar_2.message_.ptr_[0x20].field_0x4);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
          if (!bVar2) {
            testing::Message::Message(&local_258);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x65,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_258);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_258);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_270,"orig->mAttenuationConstant","read->mAttenuationConstant"
                     ,paVar7->mAttenuationConstant,
                     *(float *)((long)&gtest_ar_2.message_.ptr_[0x21]._M_string_length + 4));
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
          if (!bVar2) {
            testing::Message::Message(&local_278);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x66,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_278);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_278);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_290,"orig->mAttenuationLinear","read->mAttenuationLinear",
                     paVar7->mAttenuationLinear,*(float *)&gtest_ar_2.message_.ptr_[0x21].field_2);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
          if (!bVar2) {
            testing::Message::Message(&local_298);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x67,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_298);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_298);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
          testing::internal::DoubleNearPredFormat
                    ((internal *)local_2b0,"orig->mAttenuationQuadratic",
                     "read->mAttenuationQuadratic","0.001f",(double)paVar7->mAttenuationQuadratic,
                     (double)*(float *)((long)&gtest_ar_2.message_.ptr_[0x21].field_2 + 4),
                     0.0010000000474974513);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
          if (!bVar2) {
            testing::Message::Message(&local_2b8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x68,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_2b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_2b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_2d0,"orig->mColorAmbient.r","read->mColorAmbient.r",
                     (paVar7->mColorAmbient).r,*(float *)&gtest_ar_2.message_.ptr_[0x22].field_2);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
          if (!bVar2) {
            testing::Message::Message(&local_2d8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6a,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_2d8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_2d8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_2f0,"orig->mColorAmbient.g","read->mColorAmbient.g",
                     (paVar7->mColorAmbient).g,
                     *(float *)((long)&gtest_ar_2.message_.ptr_[0x22].field_2 + 4));
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
          if (!bVar2) {
            testing::Message::Message(&local_2f8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6b,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_9.message_,&local_2f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
            testing::Message::~Message(&local_2f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_310,"orig->mColorAmbient.b","read->mColorAmbient.b",
                     (paVar7->mColorAmbient).b,
                     *(float *)((long)&gtest_ar_2.message_.ptr_[0x22].field_2 + 8));
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
          if (!bVar2) {
            testing::Message::Message(&local_318);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6c,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_10.message_,&local_318);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
            testing::Message::~Message(&local_318);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_330,"orig->mColorDiffuse.r","read->mColorDiffuse.r",
                     (paVar7->mColorDiffuse).r,
                     *(float *)((long)&gtest_ar_2.message_.ptr_[0x21].field_2 + 8));
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
          if (!bVar2) {
            testing::Message::Message(&local_338);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6e,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_11.message_,&local_338);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
            testing::Message::~Message(&local_338);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_350,"orig->mColorDiffuse.g","read->mColorDiffuse.g",
                     (paVar7->mColorDiffuse).g,
                     *(float *)((long)&gtest_ar_2.message_.ptr_[0x21].field_2 + 0xc));
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
          if (!bVar2) {
            testing::Message::Message(&local_358);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x6f,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_12.message_,&local_358);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
            testing::Message::~Message(&local_358);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_370,"orig->mColorDiffuse.b","read->mColorDiffuse.b",
                     (paVar7->mColorDiffuse).b,*(float *)(gtest_ar_2.message_.ptr_ + 0x22));
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
          if (!bVar2) {
            testing::Message::Message(&local_378);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x70,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_13.message_,&local_378);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
            testing::Message::~Message(&local_378);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_390,"orig->mColorSpecular.r","read->mColorSpecular.r",
                     (paVar7->mColorSpecular).r,*(float *)&gtest_ar_2.message_.ptr_[0x22].field_0x4)
          ;
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
          if (!bVar2) {
            testing::Message::Message(&local_398);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x72,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_14.message_,&local_398);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
            testing::Message::~Message(&local_398);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_3b0,"orig->mColorSpecular.g","read->mColorSpecular.g",
                     (paVar7->mColorSpecular).g,
                     *(float *)&gtest_ar_2.message_.ptr_[0x22]._M_string_length);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
          if (!bVar2) {
            testing::Message::Message(&local_3b8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x73,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_15.message_,&local_3b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
            testing::Message::~Message(&local_3b8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_3d0,"orig->mColorSpecular.b","read->mColorSpecular.b",
                     (paVar7->mColorSpecular).b,
                     *(float *)((long)&gtest_ar_2.message_.ptr_[0x22]._M_string_length + 4));
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
          if (!bVar2) {
            testing::Message::Message(&local_3d8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x74,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_16.message_,&local_3d8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
            testing::Message::~Message(&local_3d8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
          testing::internal::DoubleNearPredFormat
                    ((internal *)local_3f0,"orig->mAngleInnerCone","read->mAngleInnerCone","0.001",
                     (double)paVar7->mAngleInnerCone,
                     (double)*(float *)((long)&gtest_ar_2.message_.ptr_[0x22].field_2 + 0xc),0.001);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
          if (!bVar2) {
            testing::Message::Message(&local_3f8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x76,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_17.message_,&local_3f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
            testing::Message::~Message(&local_3f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
          testing::internal::DoubleNearPredFormat
                    ((internal *)local_410,"orig->mAngleOuterCone","read->mAngleOuterCone","0.001",
                     (double)paVar7->mAngleOuterCone,
                     (double)*(float *)(gtest_ar_2.message_.ptr_ + 0x23),0.001);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
          if (!bVar2) {
            testing::Message::Message(&local_418);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
            testing::internal::AssertHelper::AssertHelper
                      (&local_420,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportLight.cpp"
                       ,0x77,pcVar3);
            testing::internal::AssertHelper::operator=(&local_420,&local_418);
            testing::internal::AssertHelper::~AssertHelper(&local_420);
            testing::Message::~Message(&local_418);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
        }
        gtest_ar__1.message_.ptr_._4_4_ = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
      std::unique_ptr<aiLight[],_std::default_delete<aiLight[]>_>::~unique_ptr
                ((unique_ptr<aiLight[],_std::default_delete<aiLight[]>_> *)
                 &origNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

TEST_F(ColladaExportLight, testExportLight)
{
    const char* file = "lightsExp.dae";

    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/Collada/lights.dae", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(pTest!=NULL);
    ASSERT_TRUE(pTest->HasLights());

    const unsigned int origNumLights( pTest->mNumLights );
    std::unique_ptr<aiLight[]> origLights( new aiLight[ origNumLights ] );
    std::vector<std::string> origNames;
    for (size_t i = 0; i < origNumLights; i++) {
        origNames.push_back( pTest->mLights[ i ]->mName.C_Str() );
        origLights[ i ] = *(pTest->mLights[ i ]);
    }

    EXPECT_EQ(AI_SUCCESS,ex->Export(pTest,"collada",file));

    const aiScene* imported = im->ReadFile(file, aiProcess_ValidateDataStructure);

    ASSERT_TRUE(imported!=NULL);

    EXPECT_TRUE(imported->HasLights());
    EXPECT_EQ( origNumLights,imported->mNumLights );
    for(size_t i=0; i< origNumLights; i++) {
        const aiLight *orig = &origLights[ i ];
        const aiLight *read = imported->mLights[i];
        EXPECT_EQ( 0,strncmp(origNames[ i ].c_str(),read->mName.C_Str(), origNames[ i ].size() ) );
        EXPECT_EQ( orig->mType,read->mType);
        EXPECT_FLOAT_EQ(orig->mAttenuationConstant,read->mAttenuationConstant);
        EXPECT_FLOAT_EQ(orig->mAttenuationLinear,read->mAttenuationLinear);
        EXPECT_NEAR(orig->mAttenuationQuadratic,read->mAttenuationQuadratic, 0.001f);

        EXPECT_FLOAT_EQ(orig->mColorAmbient.r,read->mColorAmbient.r);
        EXPECT_FLOAT_EQ(orig->mColorAmbient.g,read->mColorAmbient.g);
        EXPECT_FLOAT_EQ(orig->mColorAmbient.b,read->mColorAmbient.b);

        EXPECT_FLOAT_EQ(orig->mColorDiffuse.r,read->mColorDiffuse.r);
        EXPECT_FLOAT_EQ(orig->mColorDiffuse.g,read->mColorDiffuse.g);
        EXPECT_FLOAT_EQ(orig->mColorDiffuse.b,read->mColorDiffuse.b);

        EXPECT_FLOAT_EQ(orig->mColorSpecular.r,read->mColorSpecular.r);
        EXPECT_FLOAT_EQ(orig->mColorSpecular.g,read->mColorSpecular.g);
        EXPECT_FLOAT_EQ(orig->mColorSpecular.b,read->mColorSpecular.b);

        EXPECT_NEAR(orig->mAngleInnerCone,read->mAngleInnerCone,0.001);
        EXPECT_NEAR(orig->mAngleOuterCone,read->mAngleOuterCone,0.001);
    }
}